

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

bool duckdb_re2::ParseEscape(StringPiece *s,Rune *rp,RegexpStatus *status,int rune_max)

{
  byte bVar1;
  size_type sVar2;
  char *pcVar3;
  byte *pbVar4;
  const_pointer pcVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  Rune c;
  Rune c1;
  uint local_3c;
  int local_38;
  uint local_34;
  
  sVar2 = s->size_;
  if ((sVar2 == 0) || (pcVar3 = s->data_, *pcVar3 != '\\')) {
    status->code_ = kRegexpInternalError;
LAB_01862aee:
    (status->error_arg_).data_ = (const_pointer)0x0;
    (status->error_arg_).size_ = 0;
    goto LAB_01862af5;
  }
  if (sVar2 == 1) {
    status->code_ = kRegexpTrailingBackslash;
    goto LAB_01862aee;
  }
  s->data_ = pcVar3 + 1;
  s->size_ = sVar2 - 1;
  iVar7 = StringPieceToRune((Rune *)&local_3c,s,status);
  if (iVar7 < 0) goto LAB_01862af5;
  if ((int)local_3c < 0x61) {
    if (local_3c - 0x31 < 7) {
      if ((s->size_ == 0) || ((byte)(*s->data_ - 0x38U) < 0xf8)) goto LAB_01862dca;
    }
    else if (local_3c != 0x30) goto switchD_01862b7d_caseD_6f;
    local_3c = local_3c - 0x30;
    sVar2 = s->size_;
    if (sVar2 != 0) {
      pbVar4 = (byte *)s->data_;
      if ((*pbVar4 & 0xf8) == 0x30) {
        local_3c = ((int)(char)*pbVar4 + local_3c * 8) - 0x30;
        s->data_ = (const_pointer)(pbVar4 + 1);
        s->size_ = sVar2 - 1;
        if ((sVar2 - 1 != 0) && (bVar1 = pbVar4[1], (bVar1 & 0xf8) == 0x30)) {
          local_3c = ((int)(char)bVar1 + local_3c * 8) - 0x30;
          s->data_ = (const_pointer)(pbVar4 + 2);
          s->size_ = sVar2 - 2;
        }
      }
    }
    if (rune_max < (int)local_3c) goto LAB_01862dca;
LAB_01862c22:
    *rp = local_3c;
    goto LAB_01862d2c;
  }
  switch(local_3c) {
  case 0x6e:
    *rp = 10;
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x75:
  case 0x77:
switchD_01862b7d_caseD_6f:
    if ((((int)local_3c < 0x80) && (iVar7 = isalpha(local_3c), 9 < local_3c - 0x30)) && (iVar7 == 0)
       ) goto LAB_01862c22;
LAB_01862dca:
    status->code_ = kRegexpBadEscape;
    pcVar5 = s->data_;
    (status->error_arg_).data_ = pcVar3;
    (status->error_arg_).size_ = (long)pcVar5 - (long)pcVar3;
    goto LAB_01862af5;
  case 0x72:
    *rp = 0xd;
    break;
  case 0x74:
    *rp = 9;
    break;
  case 0x76:
    *rp = 0xb;
    break;
  case 0x78:
    if (s->size_ == 0) goto LAB_01862dca;
    iVar7 = StringPieceToRune((Rune *)&local_3c,s,status);
    if (-1 < iVar7) {
      if (local_3c == 0x7b) {
        iVar7 = StringPieceToRune((Rune *)&local_3c,s,status);
        iVar9 = 0;
        if (iVar7 < 0) goto LAB_01862af8;
        local_38 = 0;
        do {
          if ((local_3c - 0x3a < 0xfffffff6) && ((local_3c & 0xffffffdf) - 0x47 < 0xfffffffa)) {
            if (iVar9 != 0 && local_3c == 0x7d) {
              *rp = local_38;
              iVar9 = 1;
              goto LAB_01862dc0;
            }
            bVar6 = true;
            goto LAB_01862dc2;
          }
          local_38 = local_38 << 4;
          iVar7 = UnHex(local_3c);
          local_38 = iVar7 + local_38;
          bVar6 = true;
          if ((rune_max < local_38) || (s->size_ == 0)) {
            iVar9 = 0;
            goto LAB_01862dc2;
          }
          iVar7 = StringPieceToRune((Rune *)&local_3c,s,status);
          iVar9 = iVar9 + -1;
        } while (-1 < iVar7);
        iVar9 = 0;
LAB_01862dc0:
        bVar6 = false;
LAB_01862dc2:
        if (!bVar6) goto LAB_01862af8;
      }
      else if (s->size_ != 0) {
        iVar7 = StringPieceToRune((Rune *)&local_34,s,status);
        if (iVar7 < 0) goto LAB_01862af5;
        if (((0xfffffff5 < local_3c - 0x3a) || (0xfffffff9 < (local_3c & 0xffffffdf) - 0x47)) &&
           ((0xfffffff5 < local_34 - 0x3a || (0xfffffff9 < (local_34 & 0xffffffdf) - 0x47)))) {
          iVar7 = UnHex(local_3c);
          uVar8 = UnHex(local_34);
          *rp = uVar8 | iVar7 << 4;
          break;
        }
      }
      goto LAB_01862dca;
    }
LAB_01862af5:
    iVar9 = 0;
    goto LAB_01862af8;
  default:
    if (local_3c == 0x61) {
      *rp = 7;
    }
    else {
      if (local_3c != 0x66) goto switchD_01862b7d_caseD_6f;
      *rp = 0xc;
    }
  }
LAB_01862d2c:
  iVar9 = 1;
LAB_01862af8:
  return (bool)((byte)iVar9 & 1);
}

Assistant:

static bool ParseEscape(StringPiece* s, Rune* rp,
                        RegexpStatus* status, int rune_max) {
  const char* begin = s->data();
  if (s->empty() || (*s)[0] != '\\') {
    // Should not happen - caller always checks.
    status->set_code(kRegexpInternalError);
    status->set_error_arg(StringPiece());
    return false;
  }
  if (s->size() == 1) {
    status->set_code(kRegexpTrailingBackslash);
    status->set_error_arg(StringPiece());
    return false;
  }
  Rune c, c1;
  s->remove_prefix(1);  // backslash
  if (StringPieceToRune(&c, s, status) < 0)
    return false;
  int code;
  switch (c) {
    default:
      if (c < Runeself && !isalpha(c) && !isdigit(c)) {
        // Escaped non-word characters are always themselves.
        // PCRE is not quite so rigorous: it accepts things like
        // \q, but we don't.  We once rejected \_, but too many
        // programs and people insist on using it, so allow \_.
        *rp = c;
        return true;
      }
      goto BadEscape;

    // Octal escapes.
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
      // Single non-zero octal digit is a backreference; not supported.
      if (s->empty() || (*s)[0] < '0' || (*s)[0] > '7')
        goto BadEscape;
      FALLTHROUGH_INTENDED;
    case '0':
      // consume up to three octal digits; already have one.
      code = c - '0';
      if (!s->empty() && '0' <= (c = (*s)[0]) && c <= '7') {
        code = code * 8 + c - '0';
        s->remove_prefix(1);  // digit
        if (!s->empty()) {
          c = (*s)[0];
          if ('0' <= c && c <= '7') {
            code = code * 8 + c - '0';
            s->remove_prefix(1);  // digit
          }
        }
      }
      if (code > rune_max)
        goto BadEscape;
      *rp = code;
      return true;

    // Hexadecimal escapes
    case 'x':
      if (s->empty())
        goto BadEscape;
      if (StringPieceToRune(&c, s, status) < 0)
        return false;
      if (c == '{') {
        // Any number of digits in braces.
        // Update n as we consume the string, so that
        // the whole thing gets shown in the error message.
        // Perl accepts any text at all; it ignores all text
        // after the first non-hex digit.  We require only hex digits,
        // and at least one.
        if (StringPieceToRune(&c, s, status) < 0)
          return false;
        int nhex = 0;
        code = 0;
        while (IsHex(c)) {
          nhex++;
          code = code * 16 + UnHex(c);
          if (code > rune_max)
            goto BadEscape;
          if (s->empty())
            goto BadEscape;
          if (StringPieceToRune(&c, s, status) < 0)
            return false;
        }
        if (c != '}' || nhex == 0)
          goto BadEscape;
        *rp = code;
        return true;
      }
      // Easy case: two hex digits.
      if (s->empty())
        goto BadEscape;
      if (StringPieceToRune(&c1, s, status) < 0)
        return false;
      if (!IsHex(c) || !IsHex(c1))
        goto BadEscape;
      *rp = UnHex(c) * 16 + UnHex(c1);
      return true;

    // C escapes.
    case 'n':
      *rp = '\n';
      return true;
    case 'r':
      *rp = '\r';
      return true;
    case 't':
      *rp = '\t';
      return true;

    // Less common C escapes.
    case 'a':
      *rp = '\a';
      return true;
    case 'f':
      *rp = '\f';
      return true;
    case 'v':
      *rp = '\v';
      return true;

    // This code is disabled to avoid misparsing
    // the Perl word-boundary \b as a backspace
    // when in POSIX regexp mode.  Surprisingly,
    // in Perl, \b means word-boundary but [\b]
    // means backspace.  We don't support that:
    // if you want a backspace embed a literal
    // backspace character or use \x08.
    //
    // case 'b':
    //   *rp = '\b';
    //   return true;
  }

BadEscape:
  // Unrecognized escape sequence.
  status->set_code(kRegexpBadEscape);
  status->set_error_arg(
      StringPiece(begin, static_cast<size_t>(s->data() - begin)));
  return false;
}